

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O0

void __thiscall
acto::intrusive::mpsc_stack<acto::core::worker_t>::push
          (mpsc_stack<acto::core::worker_t> *this,worker_t *node)

{
  bool bVar1;
  __pointer_type local_20;
  worker_t *top;
  worker_t *node_local;
  mpsc_stack<acto::core::worker_t> *this_local;
  
  top = node;
  node_local = (worker_t *)this;
  do {
    local_20 = std::atomic<acto::core::worker_t_*>::load(&this->head_,relaxed);
    (top->super_node<acto::core::worker_t>).next = local_20;
    bVar1 = std::atomic<acto::core::worker_t_*>::compare_exchange_weak
                      (&this->head_,&local_20,top,seq_cst);
  } while (!bVar1);
  return;
}

Assistant:

void push(T* const node) noexcept {
    do {
      T* top = head_.load(std::memory_order_relaxed);
      node->next = top;
      if (head_.compare_exchange_weak(top, node)) {
        return;
      }
    } while (true);
  }